

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

int main(void)

{
  ostream *this;
  undefined1 local_8d94 [8];
  DifferingTypesTest t_78;
  DifferingTypesTest t_77;
  DifferingTypesTest t_76;
  DifferingTypesTest t_75;
  DifferingTypesTest t_74;
  ExpressionTemplateTest t_73;
  ExpressionTemplateTest t_72;
  MarrayTest t_71;
  MarrayTest t_70;
  MarrayTest t_69;
  MarrayTest t_68;
  MarrayTest t_67;
  MarrayTest t_66;
  MarrayTest t_65;
  MarrayTest t_64;
  MarrayTest t_63;
  IteratorTest t_62;
  IteratorTest t_61;
  IteratorTest t_60;
  IteratorTest t_59;
  IteratorTest t_58;
  IteratorTest t_57;
  IteratorTest t_56;
  IteratorTest t_55;
  IteratorTest t_54;
  IteratorTest t_53;
  IteratorTest t_52;
  IteratorTest t_51;
  IteratorTest t_50;
  IteratorTest t_49;
  ViewTest t_48;
  ViewTest t_47;
  ViewTest t_46;
  ViewTest t_45;
  ViewTest t_44;
  ViewTest t_43;
  ViewTest t_42;
  ViewTest t_41;
  ViewTest t_40;
  ViewTest t_39;
  ViewTest t_38;
  ViewTest t_37;
  ViewTest t_36;
  ViewTest t_35;
  ViewTest t_34;
  ViewTest t_33;
  ViewTest t_32;
  ViewTest t_31;
  ViewTest t_30;
  ViewTest t_29;
  ViewTest t_28;
  ViewTest t_27;
  ViewTest t_26;
  ViewTest t_25;
  ViewTest t_24;
  ViewTest t_23;
  ViewTest t_22;
  ViewTest t_21;
  ViewTest t_20;
  ViewTest t_19;
  ViewTest t_18;
  ViewTest t_17;
  ViewTest t_16;
  ViewTest t_15;
  ViewTest t_14;
  ViewTest t_13;
  ViewTest t_12;
  ViewTest t_11;
  ViewTest t_10;
  ViewTest t_9;
  ViewTest t_8;
  ViewTest t_7;
  ViewTest t_6;
  ViewTest t_5;
  ViewTest t_4;
  ViewTest t_3;
  ViewTest t_2;
  ViewTest t_1;
  GlobalFunctionTest t;
  
  t_1.data100_[99] = 0;
  GlobalFunctionTest::shapeStrideTest((GlobalFunctionTest *)((long)t_1.data100_ + 0x18b));
  ViewTest::ViewTest((ViewTest *)(t_2.data100_ + 0x62));
  ViewTest::coordinatesToOffsetTest<false>((ViewTest *)(t_2.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_3.data100_ + 0x62));
  ViewTest::coordinatesToOffsetTest<true>((ViewTest *)(t_3.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_4.data100_ + 0x62));
  ViewTest::coordinatesToIndexTest<false>((ViewTest *)(t_4.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_5.data100_ + 0x62));
  ViewTest::coordinatesToIndexTest<true>((ViewTest *)(t_5.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_6.data100_ + 0x62));
  ViewTest::indexToCoordinatesTest<false>((ViewTest *)(t_6.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_7.data100_ + 0x62));
  ViewTest::indexToCoordinatesTest<true>((ViewTest *)(t_7.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_8.data100_ + 0x62));
  ViewTest::indexToOffsetTest<false>((ViewTest *)(t_8.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_9.data100_ + 0x62));
  ViewTest::indexToOffsetTest<true>((ViewTest *)(t_9.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_10.data100_ + 0x62));
  ViewTest::emptyConstructorTest<false>((ViewTest *)(t_10.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_11.data100_ + 0x62));
  ViewTest::emptyConstructorTest<true>((ViewTest *)(t_11.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_12.data100_ + 0x62));
  ViewTest::scalarConstructorTest<false>((ViewTest *)(t_12.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_13.data100_ + 0x62));
  ViewTest::scalarConstructorTest<true>((ViewTest *)(t_13.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_14.data100_ + 0x62));
  ViewTest::shapeConstructorTest<false>((ViewTest *)(t_14.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_15.data100_ + 0x62));
  ViewTest::shapeConstructorTest<true>((ViewTest *)(t_15.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_16.data100_ + 0x62));
  ViewTest::shapeAssignTest<false>((ViewTest *)(t_16.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_17.data100_ + 0x62));
  ViewTest::shapeAssignTest<true>((ViewTest *)(t_17.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_18.data100_ + 0x62));
  ViewTest::shapeStrideConstructorTest<false>((ViewTest *)(t_18.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_19.data100_ + 0x62));
  ViewTest::shapeStrideConstructorTest<true>((ViewTest *)(t_19.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_20.data100_ + 0x62));
  ViewTest::shapeStrideAssignTest<false>((ViewTest *)(t_20.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_21.data100_ + 0x62));
  ViewTest::shapeStrideAssignTest<true>((ViewTest *)(t_21.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_22.data100_ + 0x62));
  ViewTest::copyConstructorTest((ViewTest *)(t_22.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_23.data100_ + 0x62));
  ViewTest::assignmentOperatorTest<(andres::CoordinateOrder)1>((ViewTest *)(t_23.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_24.data100_ + 0x62));
  ViewTest::assignmentOperatorTest<(andres::CoordinateOrder)0>((ViewTest *)(t_24.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_25.data100_ + 0x62));
  ViewTest::queryTest<false>((ViewTest *)(t_25.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_26.data100_ + 0x62));
  ViewTest::queryTest<true>((ViewTest *)(t_26.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_27.data100_ + 0x62));
  ViewTest::elementAccessTest<false>((ViewTest *)(t_27.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_28.data100_ + 0x62));
  ViewTest::elementAccessTest<true>((ViewTest *)(t_28.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_29.data100_ + 0x62));
  ViewTest::subViewsTest<false>((ViewTest *)(t_29.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_30.data100_ + 0x62));
  ViewTest::subViewsTest<true>((ViewTest *)(t_30.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_31.data100_ + 0x62));
  ViewTest::subConstViewsTest((ViewTest *)(t_31.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_32.data100_ + 0x62));
  ViewTest::iteratorAccessTest<false>((ViewTest *)(t_32.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_33.data100_ + 0x62));
  ViewTest::iteratorAccessTest<true>((ViewTest *)(t_33.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_34.data100_ + 0x62));
  ViewTest::coordinateBindingTest<false>((ViewTest *)(t_34.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_35.data100_ + 0x62));
  ViewTest::coordinateBindingTest<true>((ViewTest *)(t_35.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_36.data100_ + 0x62));
  ViewTest::transposeTest<false>((ViewTest *)(t_36.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_37.data100_ + 0x62));
  ViewTest::transposeTest<true>((ViewTest *)(t_37.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_38.data100_ + 0x62));
  ViewTest::permuteTest<false>((ViewTest *)(t_38.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_39.data100_ + 0x62));
  ViewTest::permuteTest<true>((ViewTest *)(t_39.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_40.data100_ + 0x62));
  ViewTest::shiftOperatorTest<false,(andres::CoordinateOrder)1>((ViewTest *)(t_40.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_41.data100_ + 0x62));
  ViewTest::shiftOperatorTest<false,(andres::CoordinateOrder)0>((ViewTest *)(t_41.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_42.data100_ + 0x62));
  ViewTest::shiftOperatorTest<true,(andres::CoordinateOrder)1>((ViewTest *)(t_42.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_43.data100_ + 0x62));
  ViewTest::shiftOperatorTest<true,(andres::CoordinateOrder)0>((ViewTest *)(t_43.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_44.data100_ + 0x62));
  ViewTest::arithmeticOperatorsTest((ViewTest *)(t_44.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_45.data100_ + 0x62));
  ViewTest::asStringTest<true>((ViewTest *)(t_45.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_46.data100_ + 0x62));
  ViewTest::asStringTest<false>((ViewTest *)(t_46.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_47.data100_ + 0x62));
  ViewTest::reshapeTest((ViewTest *)(t_47.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_48.data100_ + 0x62));
  ViewTest::overlapTreatmentTest((ViewTest *)(t_48.data100_ + 0x62));
  ViewTest::ViewTest((ViewTest *)(t_49.data_ + 0x16));
  ViewTest::compatibilityFunctionsTest((ViewTest *)(t_49.data_ + 0x16));
  IteratorTest::IteratorTest((IteratorTest *)(t_50.data_ + 0x16));
  IteratorTest::constructorTest<false>((IteratorTest *)(t_50.data_ + 0x16));
  IteratorTest::IteratorTest((IteratorTest *)(t_51.data_ + 0x16));
  IteratorTest::constructorTest<true>((IteratorTest *)(t_51.data_ + 0x16));
  IteratorTest::IteratorTest((IteratorTest *)(t_52.data_ + 0x16));
  IteratorTest::accessIteratorOperations<false>((IteratorTest *)(t_52.data_ + 0x16));
  IteratorTest::IteratorTest((IteratorTest *)(t_53.data_ + 0x16));
  IteratorTest::accessIteratorOperations<true>((IteratorTest *)(t_53.data_ + 0x16));
  IteratorTest::IteratorTest((IteratorTest *)(t_54.data_ + 0x16));
  IteratorTest::arithmeticOperatorsTest<false>((IteratorTest *)(t_54.data_ + 0x16));
  IteratorTest::IteratorTest((IteratorTest *)(t_55.data_ + 0x16));
  IteratorTest::arithmeticOperatorsTest<true>((IteratorTest *)(t_55.data_ + 0x16));
  IteratorTest::IteratorTest((IteratorTest *)(t_56.data_ + 0x16));
  IteratorTest::comparisonOperators<false>((IteratorTest *)(t_56.data_ + 0x16));
  IteratorTest::IteratorTest((IteratorTest *)(t_57.data_ + 0x16));
  IteratorTest::comparisonOperators<true>((IteratorTest *)(t_57.data_ + 0x16));
  IteratorTest::IteratorTest((IteratorTest *)(t_58.data_ + 0x16));
  IteratorTest::hasMoreTest<false>((IteratorTest *)(t_58.data_ + 0x16));
  IteratorTest::IteratorTest((IteratorTest *)(t_59.data_ + 0x16));
  IteratorTest::hasMoreTest<true>((IteratorTest *)(t_59.data_ + 0x16));
  IteratorTest::IteratorTest((IteratorTest *)(t_60.data_ + 0x16));
  IteratorTest::indexTest<false>((IteratorTest *)(t_60.data_ + 0x16));
  IteratorTest::IteratorTest((IteratorTest *)(t_61.data_ + 0x16));
  IteratorTest::indexTest<true>((IteratorTest *)(t_61.data_ + 0x16));
  IteratorTest::IteratorTest((IteratorTest *)(t_62.data_ + 0x16));
  IteratorTest::coordinateTest<false>((IteratorTest *)(t_62.data_ + 0x16));
  IteratorTest::IteratorTest((IteratorTest *)(t_63.data100_ + 0x62));
  IteratorTest::coordinateTest<true>((IteratorTest *)(t_63.data100_ + 0x62));
  MarrayTest::MarrayTest((MarrayTest *)(t_64.data100_ + 0x62));
  MarrayTest::constructorTest((MarrayTest *)(t_64.data100_ + 0x62));
  MarrayTest::MarrayTest((MarrayTest *)(t_65.data100_ + 0x62));
  MarrayTest::assignTest((MarrayTest *)(t_65.data100_ + 0x62));
  MarrayTest::MarrayTest((MarrayTest *)(t_66.data100_ + 0x62));
  MarrayTest::copyConstructorTest<false>((MarrayTest *)(t_66.data100_ + 0x62));
  MarrayTest::MarrayTest((MarrayTest *)(t_67.data100_ + 0x62));
  MarrayTest::copyConstructorTest<true>((MarrayTest *)(t_67.data100_ + 0x62));
  MarrayTest::MarrayTest((MarrayTest *)(t_68.data100_ + 0x62));
  MarrayTest::assignmentOperatorTest<false>((MarrayTest *)(t_68.data100_ + 0x62));
  MarrayTest::MarrayTest((MarrayTest *)(t_69.data100_ + 0x62));
  MarrayTest::assignmentOperatorTest<true>((MarrayTest *)(t_69.data100_ + 0x62));
  MarrayTest::MarrayTest((MarrayTest *)(t_70.data100_ + 0x62));
  MarrayTest::reshapeTest((MarrayTest *)(t_70.data100_ + 0x62));
  MarrayTest::MarrayTest((MarrayTest *)(t_71.data100_ + 0x62));
  MarrayTest::resizeTest<(andres::CoordinateOrder)1>((MarrayTest *)(t_71.data100_ + 0x62));
  MarrayTest::MarrayTest((MarrayTest *)(t_72.dataInt_ + 0x16));
  MarrayTest::resizeTest<(andres::CoordinateOrder)0>((MarrayTest *)(t_72.dataInt_ + 0x16));
  ExpressionTemplateTest::ExpressionTemplateTest((ExpressionTemplateTest *)(t_73.dataInt_ + 0x16));
  ExpressionTemplateTest::constructionAndAssignmentTest
            ((ExpressionTemplateTest *)(t_73.dataInt_ + 0x16));
  ExpressionTemplateTest::ExpressionTemplateTest((ExpressionTemplateTest *)(t_74.dataShort_ + 0x14))
  ;
  ExpressionTemplateTest::arithmeticOperatorsTest
            ((ExpressionTemplateTest *)(t_74.dataShort_ + 0x14));
  DifferingTypesTest::DifferingTypesTest((DifferingTypesTest *)(t_75.dataShort_ + 0x14));
  DifferingTypesTest::constructionTest((DifferingTypesTest *)(t_75.dataShort_ + 0x14));
  DifferingTypesTest::DifferingTypesTest((DifferingTypesTest *)(t_76.dataShort_ + 0x14));
  DifferingTypesTest::assignmentTest((DifferingTypesTest *)(t_76.dataShort_ + 0x14));
  DifferingTypesTest::DifferingTypesTest((DifferingTypesTest *)(t_77.dataShort_ + 0x14));
  DifferingTypesTest::arithmeticOperatorsTest((DifferingTypesTest *)(t_77.dataShort_ + 0x14));
  DifferingTypesTest::DifferingTypesTest((DifferingTypesTest *)(t_78.dataShort_ + 0x14));
  DifferingTypesTest::nonBasicTypesTest((DifferingTypesTest *)(t_78.dataShort_ + 0x14));
  DifferingTypesTest::DifferingTypesTest((DifferingTypesTest *)local_8d94);
  DifferingTypesTest::typePromotionTest((DifferingTypesTest *)local_8d94);
  this = std::operator<<((ostream *)&std::cout,"All tests have been passed.");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() 
{
    { GlobalFunctionTest t; t.shapeStrideTest(); }

    { ViewTest t; t.coordinatesToOffsetTest<false>(); }
    { ViewTest t; t.coordinatesToOffsetTest<true>(); }
    { ViewTest t; t.coordinatesToIndexTest<false>(); }
    { ViewTest t; t.coordinatesToIndexTest<true>(); }
    { ViewTest t; t.indexToCoordinatesTest<false>(); }
    { ViewTest t; t.indexToCoordinatesTest<true>(); }
    { ViewTest t; t.indexToOffsetTest<false>(); }
    { ViewTest t; t.indexToOffsetTest<true>(); }
    { ViewTest t; t.emptyConstructorTest<false>(); }
    { ViewTest t; t.emptyConstructorTest<true>(); }
    { ViewTest t; t.scalarConstructorTest<false>(); }
    { ViewTest t; t.scalarConstructorTest<true>(); }
    { ViewTest t; t.shapeConstructorTest<false>(); }
    { ViewTest t; t.shapeConstructorTest<true>(); }
    { ViewTest t; t.shapeAssignTest<false>(); }
    { ViewTest t; t.shapeAssignTest<true>(); }
    { ViewTest t; t.shapeStrideConstructorTest<false>(); }
    { ViewTest t; t.shapeStrideConstructorTest<true>(); } 
    { ViewTest t; t.shapeStrideAssignTest<false>(); }
    { ViewTest t; t.shapeStrideAssignTest<true>(); }
    { ViewTest t; t.copyConstructorTest(); } 
    { ViewTest t; t.assignmentOperatorTest<andres::LastMajorOrder>(); } 
    { ViewTest t; t.assignmentOperatorTest<andres::FirstMajorOrder>(); }
    { ViewTest t; t.queryTest<false>(); }
    { ViewTest t; t.queryTest<true>(); }
    { ViewTest t; t.elementAccessTest<false>(); }
    { ViewTest t; t.elementAccessTest<true>(); }
    { ViewTest t; t.subViewsTest<false>(); }
    { ViewTest t; t.subViewsTest<true>(); }
    { ViewTest t; t.subConstViewsTest(); }
    { ViewTest t; t.iteratorAccessTest<false>(); }
    { ViewTest t; t.iteratorAccessTest<true>(); } 
    { ViewTest t; t.coordinateBindingTest<false>(); }
    { ViewTest t; t.coordinateBindingTest<true>(); }
    { ViewTest t; t.transposeTest<false>(); }
    { ViewTest t; t.transposeTest<true>(); }
    { ViewTest t; t.permuteTest<false>(); }
    { ViewTest t; t.permuteTest<true>(); } 
    { ViewTest t; t.shiftOperatorTest<false, andres::LastMajorOrder>(); }
    { ViewTest t; t.shiftOperatorTest<false, andres::FirstMajorOrder>(); }
    { ViewTest t; t.shiftOperatorTest<true, andres::LastMajorOrder>(); }
    { ViewTest t; t.shiftOperatorTest<true, andres::FirstMajorOrder>(); } 
    { ViewTest t; t.arithmeticOperatorsTest(); }
    { ViewTest t; t.asStringTest<true>(); } 
    { ViewTest t; t.asStringTest<false>(); } 
    { ViewTest t; t.reshapeTest(); }
    { ViewTest t; t.overlapTreatmentTest(); }
    { ViewTest t; t.compatibilityFunctionsTest(); }

    { IteratorTest t; t.constructorTest<false>(); }
    { IteratorTest t; t.constructorTest<true>(); }
    { IteratorTest t; t.accessIteratorOperations<false>(); }
    { IteratorTest t; t.accessIteratorOperations<true>(); }
    { IteratorTest t; t.arithmeticOperatorsTest<false>(); }
    { IteratorTest t; t.arithmeticOperatorsTest<true>(); }
    { IteratorTest t; t.comparisonOperators<false>(); }
    { IteratorTest t; t.comparisonOperators<true>(); }
    { IteratorTest t; t.hasMoreTest<false>(); }
    { IteratorTest t; t.hasMoreTest<true>(); }
    { IteratorTest t; t.indexTest<false>(); }
    { IteratorTest t; t.indexTest<true>(); }
    { IteratorTest t; t.coordinateTest<false>(); }
    { IteratorTest t; t.coordinateTest<true>(); }

    { MarrayTest t; t.constructorTest(); } 
    { MarrayTest t; t.assignTest(); } 
    { MarrayTest t; t.copyConstructorTest<false>(); }
    { MarrayTest t; t.copyConstructorTest<true>(); }
    { MarrayTest t; t.assignmentOperatorTest<false>(); }
    { MarrayTest t; t.assignmentOperatorTest<true>(); }
    { MarrayTest t; t.reshapeTest(); } 
    { MarrayTest t; t.resizeTest<andres::LastMajorOrder>(); } 
    { MarrayTest t; t.resizeTest<andres::FirstMajorOrder>(); } 

    { ExpressionTemplateTest t; t.constructionAndAssignmentTest(); }
    { ExpressionTemplateTest t; t.arithmeticOperatorsTest(); }

    { DifferingTypesTest t; t.constructionTest(); }
    { DifferingTypesTest t; t.assignmentTest(); }
    { DifferingTypesTest t; t.arithmeticOperatorsTest(); }
    { DifferingTypesTest t; t.nonBasicTypesTest(); }
    { DifferingTypesTest t; t.typePromotionTest(); }

    #ifdef HAVE_CPP0X_INITIALIZER_LISTS
    { Cpp0xTest t; t.test(); }
    #endif

    std::cout << "All tests have been passed." << std::endl;
    return 0;
}